

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::compute_selector_factors3(hist3 *h,float *iz00,float *iz10,float *iz11)

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  double dVar3;
  float det;
  float z01;
  float z11;
  float z10;
  float z00;
  uint32_t sel;
  uint32_t weight_accum;
  float local_3c;
  uint local_28;
  uint local_24;
  
  local_24 = 0;
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    local_24 = *(int *)(g_weight_vals3 + (ulong)local_28 * 4) *
               (uint)*(byte *)(in_RDI + (ulong)local_28) + local_24;
  }
  fVar1 = (float)(local_24 >> 0x10 & 0xff);
  fVar2 = (float)(local_24 >> 8 & 0xff);
  local_3c = fVar1 * (float)(local_24 & 0xff) + -(fVar2 * fVar2);
  dVar3 = std::fabs((double)(ulong)(uint)local_3c);
  if (1e-08 <= SUB84(dVar3,0)) {
    local_3c = 0.007843138 / local_3c;
  }
  else {
    local_3c = 0.0;
  }
  *in_RSI = (float)(local_24 & 0xff) * local_3c;
  *in_RDX = -fVar2 * local_3c;
  *in_RCX = fVar1 * local_3c;
  return;
}

Assistant:

static inline void compute_selector_factors3(const hist3 &h, float &iz00, float &iz10, float &iz11)
	{
		uint32_t weight_accum = 0;
		for (uint32_t sel = 0; sel < 3; sel++)
			weight_accum += g_weight_vals3[sel] * h.m_hist[sel];

		float z00 = (float)((weight_accum >> 16) & 0xFF);
		float z10 = (float)((weight_accum >> 8) & 0xFF);
		float z11 = (float)(weight_accum & 0xFF);
		float z01 = z10;

		float det = z00 * z11 - z01 * z10;
		if (fabs(det) < 1e-8f)
			det = 0.0f;
		else
			det = (2.0f / 255.0f) / det;
				
		iz00 = z11 * det;
		iz10 = -z10 * det;
		iz11 = z00 * det;
	}